

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer_entropy.c
# Opt level: O1

double * inform_local_transfer_entropy
                   (int *src,int *dst,int *back,size_t l,size_t n,size_t m,int b,size_t k,double *te
                   ,inform_error *err)

{
  int *piVar1;
  int *piVar2;
  long lVar3;
  _Bool _Var4;
  int iVar5;
  void *__ptr;
  void *__ptr_00;
  size_t sVar6;
  int iVar7;
  int *piVar8;
  size_t sVar9;
  int *piVar10;
  long lVar11;
  size_t sVar12;
  long lVar13;
  void *pvVar14;
  int *piVar15;
  int *piVar16;
  int *piVar17;
  int iVar18;
  int iVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  double dVar24;
  double dVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  double *local_c0;
  int *local_90;
  
  _Var4 = check_arguments(src,dst,back,l,n,m,b,k,err);
  if (!_Var4) {
    lVar21 = m - k;
    lVar22 = lVar21 * n;
    local_c0 = te;
    if ((te != (double *)0x0) ||
       (local_c0 = (double *)malloc(lVar22 * 8), local_c0 != (double *)0x0)) {
      auVar27._8_4_ = (int)(k >> 0x20);
      auVar27._0_8_ = k;
      auVar27._12_4_ = 0x45300000;
      dVar24 = pow((double)b,
                   (auVar27._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)k) - 4503599627370496.0));
      auVar26._8_4_ = (int)(l >> 0x20);
      auVar26._0_8_ = l;
      auVar26._12_4_ = 0x45300000;
      dVar25 = pow((double)b,
                   (auVar26._8_8_ - 1.9342813113834067e+25) +
                   ((double)CONCAT44(0x43300000,(int)l) - 4503599627370496.0));
      lVar13 = ((long)(dVar25 - 9.223372036854776e+18) & (long)dVar25 >> 0x3f | (long)dVar25) *
               ((long)(dVar24 - 9.223372036854776e+18) & (long)dVar24 >> 0x3f | (long)dVar24);
      lVar23 = (ulong)(uint)(b * b) * lVar13;
      __ptr = calloc(lVar23 + lVar13 + b * lVar13 * 2,4);
      if (__ptr != (void *)0x0) {
        __ptr_00 = malloc(lVar22 * 0x10);
        if (__ptr_00 != (void *)0x0) {
          lVar3 = lVar13 * 4 + lVar23 * 4;
          lVar13 = b * lVar13 * 4 + lVar3;
          piVar1 = (int *)((long)__ptr_00 + lVar22 * 4);
          piVar2 = piVar1 + lVar22;
          if (n != 0) {
            piVar20 = back + (k - 1);
            sVar6 = 0;
            pvVar14 = __ptr_00;
            piVar15 = piVar2 + lVar22;
            piVar16 = piVar2;
            piVar17 = piVar1;
            local_90 = src;
            do {
              *piVar17 = 0;
              iVar5 = 1;
              if (k != 0) {
                iVar7 = 0;
                sVar9 = 0;
                do {
                  iVar5 = iVar5 * b;
                  iVar7 = iVar7 * b + dst[sVar9];
                  sVar9 = sVar9 + 1;
                } while (k != sVar9);
                *piVar17 = iVar7;
              }
              piVar8 = piVar20;
              sVar9 = k;
              if (k < m) {
                while( true ) {
                  iVar7 = 0;
                  piVar10 = piVar8;
                  sVar12 = l;
                  if (l != 0) {
                    do {
                      iVar7 = iVar7 * b + *piVar10;
                      sVar12 = sVar12 - 1;
                      piVar10 = piVar10 + m * n;
                    } while (sVar12 != 0);
                  }
                  lVar11 = sVar9 - k;
                  iVar18 = iVar7 * iVar5 + piVar17[lVar11];
                  piVar17[lVar11] = iVar18;
                  iVar19 = local_90[sVar9 - 1];
                  iVar18 = iVar18 * b + dst[sVar9];
                  piVar15[lVar11] = iVar18;
                  *(int *)((long)pvVar14 + lVar11 * 4) = iVar18 * b + iVar19;
                  iVar19 = piVar17[lVar11] * b + iVar19;
                  piVar16[lVar11] = iVar19;
                  piVar10 = (int *)((long)__ptr + (long)*(int *)((long)pvVar14 + lVar11 * 4) * 4);
                  *piVar10 = *piVar10 + 1;
                  piVar10 = (int *)((long)__ptr + (long)piVar17[lVar11] * 4 + lVar23 * 4);
                  *piVar10 = *piVar10 + 1;
                  piVar10 = (int *)((long)__ptr + (long)iVar19 * 4 + lVar3);
                  *piVar10 = *piVar10 + 1;
                  iVar19 = piVar15[lVar11];
                  piVar10 = (int *)((long)__ptr + (long)iVar19 * 4 + lVar13);
                  *piVar10 = *piVar10 + 1;
                  sVar9 = sVar9 + 1;
                  if (sVar9 == m) break;
                  piVar17[lVar11 + 1] = iVar19 - (iVar7 * b + dst[lVar11]) * iVar5;
                  piVar8 = piVar8 + 1;
                }
              }
              local_90 = local_90 + m;
              dst = dst + m;
              pvVar14 = (void *)((long)pvVar14 + lVar21 * 4);
              piVar17 = piVar17 + lVar21;
              piVar16 = piVar16 + lVar21;
              piVar15 = piVar15 + lVar21;
              sVar6 = sVar6 + 1;
              piVar20 = piVar20 + n;
            } while (sVar6 != n);
          }
          if (lVar22 != 0) {
            lVar21 = 0;
            do {
              dVar24 = log2(((double)*(uint *)((long)__ptr + (long)piVar1[lVar21] * 4 + lVar23 * 4)
                            * (double)*(uint *)((long)__ptr +
                                               (long)*(int *)((long)__ptr_00 + lVar21 * 4) * 4)) /
                            ((double)*(uint *)((long)__ptr +
                                              (long)(piVar2 + lVar22)[lVar21] * 4 + lVar13) *
                            (double)*(uint *)((long)__ptr + (long)piVar2[lVar21] * 4 + lVar3)));
              local_c0[lVar21] = dVar24;
              lVar21 = lVar21 + 1;
            } while (lVar22 != lVar21);
          }
          free(__ptr_00);
          free(__ptr);
          return local_c0;
        }
        if (te == (double *)0x0) {
          free(local_c0);
        }
        free(__ptr);
      }
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return (double *)0x0;
}

Assistant:

double *inform_local_transfer_entropy(int const *src, int const *dst,
    int const *back, size_t l, size_t n, size_t m, int b, size_t k, double *te,
    inform_error *err)
{
    if (check_arguments(src, dst, back, l, n, m, b, k, err)) return NULL;

    size_t const N = n * (m - k);

    bool allocate = (te == NULL);
    if (allocate)
    {
        te = malloc(N * sizeof(double));
        if (te == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    size_t const q = (size_t) pow((double) b, (double) k);
    size_t const r = (size_t) pow((double) b, (double) l);
    size_t const states_size     = b*b*q*r;
    size_t const histories_size  = q*r;
    size_t const sources_size    = b*q*r;
    size_t const predicates_size = b*q*r;
    size_t const total_size = states_size + histories_size + sources_size + predicates_size;

    uint32_t *histogram_data = calloc(total_size, sizeof(uint32_t));
    if (histogram_data == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }

    inform_dist states     = { histogram_data, states_size, N };
    inform_dist histories  = { histogram_data + states_size, histories_size, N };
    inform_dist sources    = { histogram_data + states_size + histories_size, sources_size, N };
    inform_dist predicates = { histogram_data + states_size + histories_size + sources_size, predicates_size, N };

    int *state_data = malloc(4 * N * sizeof(int));
    if (state_data == NULL)
    {
        if (allocate) free(te);
        free(histogram_data);
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    int *state     = state_data;
    int *history   = state + N;
    int *source    = history + N;
    int *predicate = source + N;

    accumulate_local_observations(src, dst, back, l, n, m, b, k, &states,
        &histories, &sources, &predicates, state, history, source, predicate);

    double s, t, u, v;
    for (size_t i = 0; i < N; ++i)
    {
        s = states.histogram[state[i]];
        t = sources.histogram[source[i]];
        u = predicates.histogram[predicate[i]];
        v = histories.histogram[history[i]];
        te[i] = log2((s*v)/(t*u));
    }

    free(state_data);
    free(histogram_data);

    return te;
}